

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O3

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  char cVar2;
  char cVar3;
  undefined1 auVar4 [16];
  spki_record *psVar5;
  long lVar6;
  long in_FS_OFFSET;
  long lVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar26;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = (spki_record *)malloc(0x80);
  psVar5->asn = ASN;
  auVar4 = _DAT_00107020;
  lVar6 = 0;
  auVar17 = _DAT_00107010;
  do {
    if (SUB164(auVar17 ^ auVar4,4) == -0x80000000 && SUB164(auVar17 ^ auVar4,0) < -0x7fffffec) {
      psVar5->ski[lVar6] = (char)ski_offset + (char)lVar6;
      psVar5->ski[lVar6 + 1] = (char)ski_offset + '\x01' + (char)lVar6;
    }
    lVar6 = lVar6 + 2;
    lVar8 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 2;
    auVar17._8_8_ = lVar8 + 2;
  } while (lVar6 != 0x14);
  lVar6 = 0;
  auVar7 = _DAT_00107050;
  auVar9 = _DAT_00107060;
  auVar10 = _DAT_00107070;
  auVar11 = _DAT_00107080;
  auVar12 = _DAT_00107090;
  auVar13 = _DAT_001070a0;
  auVar14 = _DAT_001070b0;
  auVar15 = _DAT_00107010;
  do {
    auVar17 = auVar15 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar27._4_4_ = iVar16;
    auVar27._0_4_ = iVar16;
    auVar27._8_4_ = iVar26;
    auVar27._12_4_ = iVar26;
    auVar35._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar35._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar35._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar35._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar18._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar35;
    auVar17 = pshuflw(auVar27,auVar18,0xe8);
    auVar17 = packssdw(auVar17,auVar17);
    cVar2 = (char)spki_offset;
    cVar3 = (char)lVar6;
    if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6] = cVar2 + cVar3;
    }
    auVar17 = packssdw(auVar18,auVar18);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._0_4_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 1] = cVar2 + cVar3 + '\x01';
    }
    auVar17 = auVar14 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar28._4_4_ = iVar16;
    auVar28._0_4_ = iVar16;
    auVar28._8_4_ = iVar26;
    auVar28._12_4_ = iVar26;
    auVar36._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar36._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar36._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar36._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar19._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar36;
    auVar17 = packssdw(auVar28,auVar19);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
      psVar5->spki[lVar6 + 2] = cVar2 + cVar3 + '\x02';
    }
    auVar17 = pshufhw(auVar19,auVar19,0x84);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._0_4_ >> 0x18 & 1) != 0) {
      psVar5->spki[lVar6 + 3] = cVar2 + cVar3 + '\x03';
    }
    auVar17 = auVar13 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar29._4_4_ = iVar16;
    auVar29._0_4_ = iVar16;
    auVar29._8_4_ = iVar26;
    auVar29._12_4_ = iVar26;
    auVar37._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar37._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar37._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar37._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar20._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar37;
    auVar17 = pshuflw(auVar29,auVar20,0xe8);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 4] = cVar2 + cVar3 + '\x04';
    }
    auVar17 = packssdw(auVar20,auVar20);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._4_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 5] = cVar2 + cVar3 + '\x05';
    }
    auVar17 = auVar12 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar30._4_4_ = iVar16;
    auVar30._0_4_ = iVar16;
    auVar30._8_4_ = iVar26;
    auVar30._12_4_ = iVar26;
    auVar38._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar38._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar38._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar38._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar21._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar38;
    auVar17 = packssdw(auVar30,auVar21);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 6] = cVar2 + cVar3 + '\x06';
    }
    auVar17 = pshufhw(auVar21,auVar21,0x84);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._6_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 7] = cVar2 + cVar3 + '\a';
    }
    auVar17 = auVar11 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar31._4_4_ = iVar16;
    auVar31._0_4_ = iVar16;
    auVar31._8_4_ = iVar26;
    auVar31._12_4_ = iVar26;
    auVar39._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar39._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar39._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar39._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar22._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar39;
    auVar17 = pshuflw(auVar31,auVar22,0xe8);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 8] = cVar2 + cVar3 + '\b';
    }
    auVar17 = packssdw(auVar22,auVar22);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._8_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 9] = cVar2 + cVar3 + '\t';
    }
    auVar17 = auVar10 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar32._4_4_ = iVar16;
    auVar32._0_4_ = iVar16;
    auVar32._8_4_ = iVar26;
    auVar32._12_4_ = iVar26;
    auVar40._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar40._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar40._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar40._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar23._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar40;
    auVar17 = packssdw(auVar32,auVar23);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 10] = cVar2 + cVar3 + '\n';
    }
    auVar17 = pshufhw(auVar23,auVar23,0x84);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._10_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 0xb] = cVar2 + cVar3 + '\v';
    }
    auVar17 = auVar9 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar33._4_4_ = iVar16;
    auVar33._0_4_ = iVar16;
    auVar33._8_4_ = iVar26;
    auVar33._12_4_ = iVar26;
    auVar41._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar41._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar41._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar41._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar24._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar41;
    auVar17 = pshuflw(auVar33,auVar24,0xe8);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 0xc] = cVar2 + cVar3 + '\f';
    }
    auVar17 = packssdw(auVar24,auVar24);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._12_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 0xd] = cVar2 + cVar3 + '\r';
    }
    auVar17 = auVar7 ^ auVar4;
    iVar16 = auVar17._0_4_;
    iVar26 = auVar17._8_4_;
    auVar34._4_4_ = iVar16;
    auVar34._0_4_ = iVar16;
    auVar34._8_4_ = iVar26;
    auVar34._12_4_ = iVar26;
    auVar42._0_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar42._4_4_ = -(uint)(iVar16 < -0x7fffffa5);
    auVar42._8_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar42._12_4_ = -(uint)(iVar26 < -0x7fffffa5);
    auVar25._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar42;
    auVar17 = packssdw(auVar34,auVar25);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      psVar5->spki[lVar6 + 0xe] = cVar2 + cVar3 + '\x0e';
    }
    auVar17 = pshufhw(auVar25,auVar25,0x84);
    auVar17 = packssdw(auVar17,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17._14_2_ >> 8 & 1) != 0) {
      psVar5->spki[lVar6 + 0xf] = cVar2 + cVar3 + '\x0f';
    }
    lVar6 = lVar6 + 0x10;
    lVar8 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 0x10;
    auVar15._8_8_ = lVar8 + 0x10;
    lVar8 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 0x10;
    auVar14._8_8_ = lVar8 + 0x10;
    lVar8 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 0x10;
    auVar13._8_8_ = lVar8 + 0x10;
    lVar8 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar8 + 0x10;
    lVar8 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 0x10;
    auVar11._8_8_ = lVar8 + 0x10;
    lVar8 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 0x10;
    auVar10._8_8_ = lVar8 + 0x10;
    lVar8 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 0x10;
    auVar9._8_8_ = lVar8 + 0x10;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 0x10;
    auVar7._8_8_ = lVar8 + 0x10;
  } while (lVar6 != 0x60);
  psVar5->socket = (rtr_socket *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return psVar5;
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski); i++)
		record->ski[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki); i++)
		record->spki[i] = i + spki_offset;

	record->socket = socket;
	return record;
}